

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.cpp
# Opt level: O2

void __thiscall encoder::count_bytes(encoder *this)

{
  vector<char,_std::allocator<char>_> buffer;
  allocator_type local_21;
  _Vector_base<char,_std::allocator<char>_> local_20;
  
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_20,(this->super_basic_coder).buffer_size,
             &local_21);
  while (((&(this->super_basic_coder).field_0x20)
          [*(long *)(*(long *)&this->super_basic_coder + -0x18)] & 5) == 0) {
    std::istream::read((char *)this,(long)local_20._M_impl.super__Vector_impl_data._M_start);
    tree::update_dict((this->super_basic_coder).h_tree._M_t.
                      super___uniq_ptr_impl<tree,_std::default_delete<tree>_>._M_t.
                      super__Tuple_impl<0UL,_tree_*,_std::default_delete<tree>_>.
                      super__Head_base<0UL,_tree_*,_false>._M_head_impl,
                      local_20._M_impl.super__Vector_impl_data._M_start,
                      *(size_t *)&(this->super_basic_coder).field_0x8);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_20);
  return;
}

Assistant:

void encoder::count_bytes() {
    std::vector<char> buffer(buffer_size);
    while (src_file) {
        src_file.read(buffer.data(), buffer_size);
        h_tree->update_dict(buffer.data(), static_cast<size_t>(src_file.gcount()));
    }
}